

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SettingsHandlerWindow_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  int iVar1;
  ImVec2 IVar2;
  ImVec2 local_54 [2];
  ImVec2 local_44;
  int local_3c;
  float local_38;
  int i;
  float y;
  float x;
  ImGuiWindowSettings *settings;
  char *line_local;
  void *entry_local;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *param_0_local;
  
  _y = entry;
  settings = (ImGuiWindowSettings *)line;
  line_local = (char *)entry;
  entry_local = param_2;
  param_1_local = (ImGuiSettingsHandler *)param_1;
  iVar1 = __isoc99_sscanf(line,"Pos=%f,%f",&i,&local_38);
  if (iVar1 == 2) {
    ImVec2::ImVec2(&local_44,(float)i,local_38);
    *(ImVec2 *)((long)_y + 0xc) = local_44;
  }
  else {
    iVar1 = __isoc99_sscanf(settings,"Size=%f,%f",&i,&local_38);
    if (iVar1 == 2) {
      ImVec2::ImVec2(local_54,(float)i,local_38);
      IVar2 = ImMax(local_54,&(GImGui->Style).WindowMinSize);
      *(ImVec2 *)((long)_y + 0x14) = IVar2;
    }
    else {
      iVar1 = __isoc99_sscanf(settings,"Collapsed=%d",&local_3c);
      if (iVar1 == 1) {
        *(bool *)((long)_y + 0x1c) = local_3c != 0;
      }
    }
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    float x, y; 
    int i;
    if (sscanf(line, "Pos=%f,%f", &x, &y) == 2)         settings->Pos = ImVec2(x, y);
    else if (sscanf(line, "Size=%f,%f", &x, &y) == 2)   settings->Size = ImMax(ImVec2(x, y), GImGui->Style.WindowMinSize);
    else if (sscanf(line, "Collapsed=%d", &i) == 1)     settings->Collapsed = (i != 0);
}